

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O3

bool __thiscall
EnrichableAnalyzerSubprocess::SendOutputLine
          (EnrichableAnalyzerSubprocess *this,char *buffer,uint bufferLength)

{
  write(this->outpipefd[1],buffer,(ulong)bufferLength);
  return true;
}

Assistant:

bool EnrichableAnalyzerSubprocess::SendOutputLine(const char* buffer, unsigned bufferLength) {
	#ifdef SUBPROCESS_DEBUG
		std::cerr << ">> ";
		std::cerr << buffer;
	#endif
	write(outpipefd[1], buffer, bufferLength);

	return true;
}